

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

char * mpt_encoding_type(int type)

{
  byte *pbVar1;
  size_t *psVar2;
  long lVar3;
  
  lVar3 = 9;
  psVar2 = &mpt_decode_command::_def.data.len;
  do {
    lVar3 = lVar3 + -1;
    if (lVar3 == 0) {
      return (char *)0x0;
    }
    pbVar1 = (byte *)((long)psVar2 + 0x3f);
    psVar2 = psVar2 + 4;
  } while ((uint)*pbVar1 != type);
  return (char *)psVar2;
}

Assistant:

extern const char *mpt_encoding_type(int type)
{
	static const int max = sizeof(_encodings)/sizeof(*_encodings);
	int i;
	
	for (i = 0; i < max; ++i) {
		if (((int) _encodings[i].id) == type) {
			return _encodings[i].name;
		}
	}
	return 0;
}